

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WeightedSnapshot.cc
# Opt level: O0

vector<long,_std::allocator<long>_> * __thiscall
cppmetrics::WeightedSnapshot::get_values
          (vector<long,_std::allocator<long>_> *__return_storage_ptr__,WeightedSnapshot *this)

{
  size_type __n;
  const_iterator cVar1;
  const_iterator cVar2;
  back_insert_iterator<std::vector<long,_std::allocator<long>_>_> bVar3;
  WeightedSnapshot *this_local;
  vector<long,_std::allocator<long>_> *values;
  
  std::vector<long,_std::allocator<long>_>::vector(__return_storage_ptr__);
  __n = std::
        vector<cppmetrics::WeightedSnapshot::Element,_std::allocator<cppmetrics::WeightedSnapshot::Element>_>
        ::size(&this->m_elements);
  std::vector<long,_std::allocator<long>_>::reserve(__return_storage_ptr__,__n);
  cVar1 = std::
          begin<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                    (&this->m_elements);
  cVar2 = std::
          end<std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>
                    (&this->m_elements);
  bVar3 = std::back_inserter<std::vector<long,std::allocator<long>>>(__return_storage_ptr__);
  std::
  transform<__gnu_cxx::__normal_iterator<cppmetrics::WeightedSnapshot::Element_const*,std::vector<cppmetrics::WeightedSnapshot::Element,std::allocator<cppmetrics::WeightedSnapshot::Element>>>,std::back_insert_iterator<std::vector<long,std::allocator<long>>>,cppmetrics::WeightedSnapshot::get_values()const::__0>
            (cVar1._M_current,cVar2._M_current,bVar3.container);
  return __return_storage_ptr__;
}

Assistant:

const std::vector<long> WeightedSnapshot::get_values() const
{
  std::vector<long> values;
  values.reserve(m_elements.size());
  std::transform(
      std::begin(m_elements),
      std::end(m_elements),
      std::back_inserter(values),
      [](const Element& elem) { return elem.value; }
  );
  return values;
}